

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O0

void testTranslationRotationMatrix<double>(M44d *mat)

{
  int iVar1;
  reference pvVar2;
  reference m;
  reference pvVar3;
  reference pvVar4;
  double dVar5;
  double b_00;
  double c;
  V3d b2;
  V3d b1;
  V3d b_1;
  V3d a_1;
  size_t i_1;
  double eps;
  M44d m2;
  M44d m1;
  vector<double,_std::allocator<double>_> weights;
  V3d b;
  V3d a;
  size_t i;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> to;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> from;
  size_t numPoints;
  value_type *in_stack_fffffffffffffcf8;
  size_type __n;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
  *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  undefined4 uVar6;
  value_type_conflict2 *in_stack_fffffffffffffd10;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *this;
  size_type in_stack_fffffffffffffd18;
  Matrix44<double> *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  undefined4 uVar7;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
  *in_stack_fffffffffffffd30;
  Vec3<double> local_220;
  Vec3<double> local_208;
  size_type local_1f0;
  undefined8 local_1e8;
  Vec3 local_1e0 [24];
  Matrix44<double> *in_stack_fffffffffffffe38;
  ostream *in_stack_fffffffffffffe40;
  Vec3 local_160 [136];
  undefined8 local_d8;
  vector<double,_std::allocator<double>_> local_d0;
  Vec3<double> local_b8;
  Vec3<double> local_a0;
  Vec3<double> local_88;
  Vec3<double> local_70;
  ulong local_58;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> local_50;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> local_38;
  ulong local_20;
  
  std::operator<<((ostream *)&std::cout,"Testing known translate/rotate matrix:\n ");
  Imath_3_2::operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  if (testTranslationRotationMatrix<double>(Imath_3_2::Matrix44<double>const&)::rand == '\0') {
    iVar1 = __cxa_guard_acquire(&testTranslationRotationMatrix<double>(Imath_3_2::Matrix44<double>const&)
                                 ::rand);
    if (iVar1 != 0) {
      Imath_3_2::Rand48::Rand48
                ((Rand48 *)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
      __cxa_guard_release(&testTranslationRotationMatrix<double>(Imath_3_2::Matrix44<double>const&)
                           ::rand);
    }
  }
  local_20 = 7;
  std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::vector
            ((vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *)0x19462c)
  ;
  std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::reserve
            (in_stack_fffffffffffffd30,CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
            );
  std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::vector
            ((vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *)0x194655)
  ;
  std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::reserve
            (in_stack_fffffffffffffd30,CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
            );
  for (local_58 = 0; local_58 < local_20; local_58 = local_58 + 1) {
    dVar5 = Imath_3_2::Rand48::nextf((Rand48 *)0x194697);
    b_00 = Imath_3_2::Rand48::nextf((Rand48 *)0x1946ab);
    c = Imath_3_2::Rand48::nextf((Rand48 *)0x1946bf);
    Imath_3_2::Vec3<double>::Vec3(&local_70,dVar5,b_00,c);
    Imath_3_2::operator*
              ((Vec3<double> *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
               in_stack_fffffffffffffd20);
    Imath_3_2::Vec3<double>::Vec3(&local_a0,&local_70);
    std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::push_back
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    Imath_3_2::Vec3<double>::Vec3(&local_b8,&local_88);
    std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::push_back
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  }
  local_d8 = 0x3ff0000000000000;
  std::allocator<double>::allocator((allocator<double> *)0x194801);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd20,
             in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  std::allocator<double>::~allocator((allocator<double> *)0x19482f);
  uVar7 = 0;
  this = (vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *)0x0;
  pvVar2 = std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::
           operator[](&local_38,0);
  m = std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::operator[]
                (&local_50,(size_type)this);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_d0,(size_type)this);
  Imath_3_2::procrustesRotationAndTranslation<double>
            (local_160,(Vec3 *)pvVar2,&m->x,(ulong)pvVar3,SUB81(local_20,0));
  uVar6 = 0;
  __n = 0;
  pvVar2 = std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::
           operator[](&local_38,0);
  pvVar4 = std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::
           operator[](&local_50,__n);
  Imath_3_2::procrustesRotationAndTranslation<double>
            (local_1e0,(Vec3 *)pvVar2,(ulong)pvVar4,SUB81(local_20,0));
  local_1e8 = 0x3e45798ee2308c3a;
  local_1f0 = 0;
  while( true ) {
    if (local_20 <= local_1f0) {
      std::operator<<((ostream *)&std::cout,"  OK\n");
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)this);
      std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::~vector(this)
      ;
      std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::~vector(this)
      ;
      return;
    }
    pvVar4 = std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::
             operator[](&local_38,local_1f0);
    Imath_3_2::Vec3<double>::Vec3(&local_208,pvVar4);
    pvVar4 = std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::
             operator[](&local_50,local_1f0);
    Imath_3_2::Vec3<double>::Vec3(&local_220,pvVar4);
    Imath_3_2::operator*
              ((Vec3<double> *)CONCAT44(uVar7,in_stack_fffffffffffffd28),(Matrix44<double> *)m);
    Imath_3_2::operator*
              ((Vec3<double> *)CONCAT44(uVar7,in_stack_fffffffffffffd28),(Matrix44<double> *)m);
    Imath_3_2::Vec3<double>::operator-
              ((Vec3<double> *)CONCAT44(uVar6,in_stack_fffffffffffffd08),pvVar2);
    dVar5 = Imath_3_2::Vec3<double>::length
                      ((Vec3<double> *)CONCAT44(uVar6,in_stack_fffffffffffffd08));
    if (1e-08 <= dVar5) break;
    Imath_3_2::Vec3<double>::operator-
              ((Vec3<double> *)CONCAT44(uVar6,in_stack_fffffffffffffd08),pvVar2);
    dVar5 = Imath_3_2::Vec3<double>::length
                      ((Vec3<double> *)CONCAT44(uVar6,in_stack_fffffffffffffd08));
    if (1e-08 <= dVar5) {
      __assert_fail("(b - b2).length () < eps",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                    ,0x3c,"void testTranslationRotationMatrix(const Imath_3_2::M44d &) [T = double]"
                   );
    }
    local_1f0 = local_1f0 + 1;
  }
  __assert_fail("(b - b1).length () < eps",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                ,0x3b,"void testTranslationRotationMatrix(const Imath_3_2::M44d &) [T = double]");
}

Assistant:

void
testTranslationRotationMatrix (const IMATH_INTERNAL_NAMESPACE::M44d& mat)
{
    std::cout << "Testing known translate/rotate matrix:\n " << mat;
    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> Vec;

    static IMATH_INTERNAL_NAMESPACE::Rand48 rand (2047);

    size_t           numPoints = 7;
    std::vector<Vec> from;
    from.reserve (numPoints);
    std::vector<Vec> to;
    to.reserve (numPoints);
    for (size_t i = 0; i < numPoints; ++i)
    {
        IMATH_INTERNAL_NAMESPACE::V3d a (
            rand.nextf (), rand.nextf (), rand.nextf ());
        IMATH_INTERNAL_NAMESPACE::V3d b = a * mat;

        from.push_back (Vec (a));
        to.push_back (Vec (b));
    }

    std::vector<T>                       weights (numPoints, T (1));
    const IMATH_INTERNAL_NAMESPACE::M44d m1 = procrustesRotationAndTranslation (
        &from[0], &to[0], &weights[0], numPoints);
    const IMATH_INTERNAL_NAMESPACE::M44d m2 =
        procrustesRotationAndTranslation (&from[0], &to[0], numPoints);

    const T eps = sizeof (T) == 8 ? T(1e-8) : T(1e-4);
    for (size_t i = 0; i < numPoints; ++i)
    {
        const IMATH_INTERNAL_NAMESPACE::V3d a  = from[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b  = to[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b1 = a * m1;
        const IMATH_INTERNAL_NAMESPACE::V3d b2 = a * m2;

        assert ((b - b1).length () < eps);
        assert ((b - b2).length () < eps);
    }
    std::cout << "  OK\n";
}